

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O0

result __thiscall
fmt::v7::detail::fixed_handler::on_start
          (fixed_handler *this,uint64_t divisor,uint64_t remainder,uint64_t error,int *exp)

{
  long lVar1;
  round_direction rVar2;
  uint64_t in_RCX;
  uint64_t in_RDX;
  uint64_t in_RSI;
  long *in_RDI;
  int *in_R8;
  round_direction dir;
  undefined1 local_41;
  result local_4;
  
  if ((*(byte *)((long)in_RDI + 0x14) & 1) == 0) {
    local_4 = more;
  }
  else {
    *(int *)((long)in_RDI + 0xc) = *in_R8 + (int)in_RDI[2] + *(int *)((long)in_RDI + 0xc);
    if (*(int *)((long)in_RDI + 0xc) < 1) {
      if (*(int *)((long)in_RDI + 0xc) < 0) {
        local_4 = done;
      }
      else {
        rVar2 = get_round_direction(in_RSI,in_RDX,in_RCX);
        if (rVar2 == unknown) {
          local_4 = error;
        }
        else {
          local_41 = 0x31;
          if (rVar2 != up) {
            local_41 = 0x30;
          }
          lVar1 = in_RDI[1];
          *(int *)(in_RDI + 1) = (int)lVar1 + 1;
          *(undefined1 *)(*in_RDI + (long)(int)lVar1) = local_41;
          local_4 = done;
        }
      }
    }
    else {
      local_4 = more;
    }
  }
  return local_4;
}

Assistant:

digits::result on_start(uint64_t divisor, uint64_t remainder, uint64_t error,
                          int& exp) {
    // Non-fixed formats require at least one digit and no precision adjustment.
    if (!fixed) return digits::more;
    // Adjust fixed precision by exponent because it is relative to decimal
    // point.
    precision += exp + exp10;
    // Check if precision is satisfied just by leading zeros, e.g.
    // format("{:.2f}", 0.001) gives "0.00" without generating any digits.
    if (precision > 0) return digits::more;
    if (precision < 0) return digits::done;
    auto dir = get_round_direction(divisor, remainder, error);
    if (dir == round_direction::unknown) return digits::error;
    buf[size++] = dir == round_direction::up ? '1' : '0';
    return digits::done;
  }